

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

bool __thiscall
Rml::DataExpressionInterface::SetValue
          (DataExpressionInterface *this,DataAddress *address,Variant *value)

{
  bool bVar1;
  DataVariable variable;
  DataVariable local_28;
  
  if ((((this->data_model != (DataModel *)0x0) &&
       ((address->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)
        ._M_impl.super__Vector_impl_data._M_start !=
        (address->super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>)
        ._M_impl.super__Vector_impl_data._M_finish)) &&
      (local_28 = DataModel::GetVariable(this->data_model,address),
      local_28.definition != (VariableDefinition *)0x0)) &&
     (bVar1 = DataVariable::Set(&local_28,value), bVar1)) {
    DataModel::DirtyVariable
              (this->data_model,
               &((address->
                 super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>).
                 _M_impl.super__Vector_impl_data._M_start)->name);
    return true;
  }
  return false;
}

Assistant:

bool DataExpressionInterface::SetValue(const DataAddress& address, const Variant& value) const
{
	bool result = false;
	if (data_model && !address.empty())
	{
		if (DataVariable variable = data_model->GetVariable(address))
			result = variable.Set(value);

		if (result)
			data_model->DirtyVariable(address.front().name);
	}
	return result;
}